

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O1

shared_ptr<gmlc::networking::AsioContextManager> __thiscall
gmlc::networking::AsioContextManager::getContextPointer
          (AsioContextManager *this,string *contextName)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  iterator iVar3;
  AsioContextManager *pAVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gmlc::networking::AsioContextManager> sVar5;
  AsioContextManager *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  this->_vptr_AsioContextManager = (_func_int **)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>)._M_weak_this.
  super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)contextLock);
  if (iVar2 == 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
                    *)contexts_abi_cxx11_,contextName);
    if (iVar3._M_node == (_Base_ptr)(contexts_abi_cxx11_ + 8)) {
      pAVar4 = (AsioContextManager *)operator_new(0x98);
      AsioContextManager(pAVar4,contextName);
      local_38 = pAVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<gmlc::networking::AsioContextManager*>(a_Stack_30,pAVar4);
      std::__shared_ptr<gmlc::networking::AsioContextManager,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<gmlc::networking::AsioContextManager,gmlc::networking::AsioContextManager>
                ((__shared_ptr<gmlc::networking::AsioContextManager,(__gnu_cxx::_Lock_policy)2> *)
                 &local_38,pAVar4);
      _Var1._M_pi = a_Stack_30[0]._M_pi;
      pAVar4 = local_38;
      local_38 = (AsioContextManager *)0x0;
      a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>).
                _M_weak_this.
                super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      this->_vptr_AsioContextManager = (_func_int **)pAVar4;
      (this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>)._M_weak_this.
      super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var1._M_pi;
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if ((element_type *)a_Stack_30[0]._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>>
      ::
      _M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<gmlc::networking::AsioContextManager>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>>
                  *)contexts_abi_cxx11_,contextName,
                 (shared_ptr<gmlc::networking::AsioContextManager> *)this);
    }
    else {
      this->_vptr_AsioContextManager = *(_func_int ***)(iVar3._M_node + 2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iVar3._M_node[2]._M_parent);
    }
    pthread_mutex_unlock((pthread_mutex_t *)contextLock);
    sVar5.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar5.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = this;
    return (shared_ptr<gmlc::networking::AsioContextManager>)
           sVar5.
           super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

std::shared_ptr<AsioContextManager>
    AsioContextManager::getContextPointer(const std::string& contextName)
{
    std::shared_ptr<AsioContextManager> contextPtr;
    std::lock_guard<std::mutex> ctxlock(
        contextLock);  // just to ensure that nothing funny happens if you try
    // to get a context while it is being constructed
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        contextPtr = fnd->second;
        return contextPtr;
    }

    contextPtr = std::shared_ptr<AsioContextManager>(
        new AsioContextManager(contextName));
    contexts.emplace(contextName, contextPtr);
    return contextPtr;
    // if it doesn't find it make a new one with the appropriate name
}